

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O2

void __thiscall QLayout::removeItem(QLayout *this,QLayoutItem *item)

{
  QLayoutItem *pQVar1;
  int i;
  int iVar2;
  
  iVar2 = 0;
  while( true ) {
    pQVar1 = (QLayoutItem *)(**(code **)(*(long *)this + 0xa8))(this,iVar2);
    if (pQVar1 == (QLayoutItem *)0x0) break;
    if (pQVar1 == item) {
      (**(code **)(*(long *)this + 0xb0))(this,iVar2);
      (**(code **)(*(long *)this + 0x70))(this);
    }
    else {
      iVar2 = iVar2 + 1;
    }
  }
  return;
}

Assistant:

void QLayout::removeItem(QLayoutItem *item)
{
    int i = 0;
    QLayoutItem *child;
    while ((child = itemAt(i))) {
        if (child == item) {
            takeAt(i);
            invalidate();
        } else {
            ++i;
        }
    }
}